

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O0

void test_bson_as_json_decimal128(void)

{
  byte bVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 local_30;
  bson_decimal128_t decimal128;
  char *str;
  bson_t *b;
  size_t len;
  
  decimal128.low = 0x3040000000000000;
  local_30 = 0xb;
  uVar3 = bson_new();
  bVar1 = bson_append_decimal128(uVar3,"decimal128",0xffffffff,&local_30);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x1b9,"test_bson_as_json_decimal128",
            "bson_append_decimal128 (b, \"decimal128\", -1, &decimal128)");
    abort();
  }
  decimal128.high = bson_as_json(uVar3,&b);
  if ((char *)decimal128.high != "{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }") {
    iVar2 = strcmp((char *)decimal128.high,"{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }");
    if (iVar2 != 0) {
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n",decimal128.high,
              "{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }");
      abort();
    }
  }
  bson_free(decimal128.high);
  bson_destroy(uVar3);
  return;
}

Assistant:

static void
test_bson_as_json_decimal128 (void)
{
   size_t len;
   bson_t *b;
   char *str;
   bson_decimal128_t decimal128;
   decimal128.high = 0x3040000000000000ULL;
   decimal128.low = 0x000000000000000B;

   b = bson_new ();
   BSON_ASSERT (bson_append_decimal128 (b, "decimal128", -1, &decimal128));
   str = bson_as_json (b, &len);
   ASSERT_CMPSTR (str,
                  "{ "
                  "\"decimal128\" : { \"$numberDecimal\" : \"11\" }"
                  " }");

   bson_free (str);
   bson_destroy (b);
}